

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpnint.h
# Opt level: O3

CTcPrsNode * __thiscall CTPNUnaryBase::fold_constants(CTPNUnaryBase *this,CTcPrsSymtab *symtab)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CTPNUnaryBase *pCVar2;
  
  iVar1 = (*(this->sub_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xf])();
  this->sub_ = (CTcPrsNode *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*(this->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0x1a])(this);
  pCVar2 = (CTPNUnaryBase *)CONCAT44(extraout_var_00,iVar1);
  if ((CTPNUnaryBase *)CONCAT44(extraout_var_00,iVar1) == (CTPNUnaryBase *)0x0) {
    pCVar2 = this;
  }
  return &pCVar2->super_CTcPrsNode;
}

Assistant:

class CTcPrsNode *fold_constants(class CTcPrsSymtab *symtab)
    {
        class CTcPrsNode *ret;
        
        /* fold constants on my subexpression */
        sub_ = sub_->fold_constants(symtab);

        /* try folding the unary operator */
        ret = fold_unop();

        /* 
         *   if we folded the operator, return the result; otherwise,
         *   return the original operator tree for full code generation 
         */
        return (ret != 0 ? ret : this);
    }